

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O2

void __thiscall LEFReader::error(LEFReader *this,string *errstr)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Line ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," : ");
  std::operator<<(poVar1,(string *)errstr);
  return;
}

Assistant:

void LEFReader::error(const std::string &errstr)
{
    std::cerr << "Line " << m_lineNum << " : " << errstr; 
}